

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx.cpp
# Opt level: O3

int __thiscall ncnn::InnerProduct_x86_avx::create_pipeline(InnerProduct_x86_avx *this,Option *opt)

{
  uint _h;
  int iVar1;
  int iVar2;
  _func_int **pp_Var3;
  void *pvVar4;
  size_t sVar5;
  Layer *pLVar6;
  undefined4 *puVar7;
  _func_int *p_Var8;
  ulong uVar9;
  undefined4 *puVar10;
  int _w;
  undefined4 *puVar11;
  ulong uVar12;
  undefined4 *puVar13;
  ulong uVar14;
  uint _elempack;
  ulong uVar15;
  ParamDict pd;
  Mat local_78;
  
  pLVar6 = create_layer(0xe);
  this->flatten = pLVar6;
  ParamDict::ParamDict((ParamDict *)&local_78);
  (*this->flatten->_vptr_Layer[2])(this->flatten,&local_78);
  (*this->flatten->_vptr_Layer[4])(this->flatten,opt);
  ParamDict::~ParamDict((ParamDict *)&local_78);
  p_Var8 = this->_vptr_InnerProduct_x86_avx[-3];
  if ((opt->use_int8_inference == true) && (*(long *)(&this->field_0x140 + (long)p_Var8) == 1)) {
    create_pipeline_int8_x86(this,opt);
  }
  else {
    _h = *(uint *)(p_Var8 + 0x28 + (long)&(this->weight_data_int8).data);
    iVar1 = *(int *)(p_Var8 + 0x30 + (long)&(this->weight_data_int8).data);
    if (opt->use_packing_layout == true) {
      if ((_h & 7) == 0) {
        _elempack = 8;
      }
      else {
        if ((_h & 3) != 0) {
          return 0;
        }
        _elempack = 4;
      }
      _w = (int)((long)iVar1 / (long)(int)_h);
      Mat::reshape(&local_78,(Mat *)(p_Var8 + 0x40 + (long)&(this->scales_in).data),_w,_h,
                   (Allocator *)0x0);
      Mat::create(&this->weight_data_packed,_w,
                  *(int *)(this->_vptr_InnerProduct_x86_avx[-3] + 0x28 +
                          (long)&(this->weight_data_int8).data) / (int)_elempack,
                  (ulong)(_elempack * 4),_elempack,(Allocator *)0x0);
      pp_Var3 = this->_vptr_InnerProduct_x86_avx;
      p_Var8 = pp_Var3[-3];
      if ((int)_elempack <= *(int *)(p_Var8 + 0x28 + (long)&(this->weight_data_int8).data)) {
        pvVar4 = (this->weight_data_packed).data;
        iVar2 = (this->weight_data_packed).w;
        sVar5 = (this->weight_data_packed).elemsize;
        uVar14 = (ulong)_elempack;
        uVar9 = 0;
        puVar11 = (undefined4 *)local_78.data;
        do {
          if (0 < _w) {
            puVar7 = (undefined4 *)
                     (((uVar9 & 0xffffffff) / (ulong)_elempack) * (long)iVar2 * sVar5 + (long)pvVar4
                     );
            uVar12 = 0;
            puVar10 = puVar11;
            uVar15 = uVar14;
            puVar13 = puVar11;
            do {
              do {
                *puVar7 = *puVar10;
                puVar7 = puVar7 + 1;
                uVar15 = uVar15 - 1;
                puVar10 = (undefined4 *)((long)puVar10 + (long)local_78.w * local_78.elemsize);
              } while (uVar15 != 0);
              uVar12 = uVar12 + 1;
              puVar10 = puVar13 + 1;
              uVar15 = uVar14;
              puVar13 = puVar10;
            } while (uVar12 != ((long)iVar1 / (long)(int)_h & 0xffffffffU));
            p_Var8 = pp_Var3[-3];
          }
          uVar9 = uVar9 + uVar14;
          puVar11 = (undefined4 *)((long)puVar11 + (long)local_78.w * local_78.elemsize * uVar14);
        } while ((long)(uVar9 + (_elempack - 1)) <
                 (long)*(int *)(p_Var8 + 0x28 + (long)&(this->weight_data_int8).data));
      }
      if (local_78.refcount != (int *)0x0) {
        LOCK();
        *local_78.refcount = *local_78.refcount + -1;
        UNLOCK();
        if (*local_78.refcount == 0) {
          if (local_78.allocator == (Allocator *)0x0) {
            if ((undefined4 *)local_78.data != (undefined4 *)0x0) {
              free(local_78.data);
            }
          }
          else {
            (*(local_78.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int InnerProduct_x86_avx::create_pipeline(const Option& opt)
{
    //     if (opt.use_packing_layout)
    {
        flatten = ncnn::create_layer(ncnn::LayerType::Flatten);

        ncnn::ParamDict pd;

        flatten->load_param(pd);

        flatten->create_pipeline(opt);
    }

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    if (out_elempack != 1)
    {
        // src = inch-outch
        // dst = pb-inch-outch/pb
        {
            Mat weight_data_r2 = weight_data.reshape(num_input, num_output);

            weight_data_packed.create(num_input, num_output / out_elempack, (size_t)4u * out_elempack, out_elempack);

            for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
            {
                float* g0 = weight_data_packed.row(q / out_elempack);

                for (int p = 0; p < num_input; p++)
                {
                    for (int j = 0; j < out_elempack; j++)
                    {
                        *g0++ = weight_data_r2.row(q + j)[p];
                    }
                }
            }
        }
    }

#if __AVX2__
    if (opt.use_weight_fp16_storage && weight_data.elemsize == 4u)
    {
        ncnn::cast_float32_to_float16(weight_data, weight_data_fp16, opt);

        return 0;
    }
#endif

    return 0;
}